

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveHeaderSize::writeTempData(CDirectiveHeaderSize *this,TempData *tempData)

{
  int64_t memoryAddress;
  char *pcVar1;
  long *in_R8;
  char *local_48;
  char *local_40;
  string local_38;
  
  memoryAddress = this->virtualAddress;
  pcVar1 = (char *)this->headerSize;
  local_40 = "";
  if ((long)pcVar1 < 0) {
    local_40 = "-";
  }
  local_48 = (char *)-(long)pcVar1;
  if (0 < (long)pcVar1) {
    local_48 = pcVar1;
  }
  tinyformat::format<char_const*,long>
            (&local_38,(tinyformat *)".headersize %s0x%08X",(char *)&local_40,&local_48,in_R8);
  TempData::writeLine(tempData,memoryAddress,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CDirectiveHeaderSize::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".headersize %s0x%08X",
		headerSize < 0 ? "-" : "", headerSize < 0 ? -headerSize : headerSize));
}